

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O0

ssize_t __thiscall
Dashel::FileDescriptorStream::read(FileDescriptorStream *this,int __fd,void *__buf,size_t __nbytes)

{
  _func_int *p_Var1;
  uint uVar2;
  undefined4 extraout_var;
  unsigned_long *puVar3;
  ssize_t sVar4;
  int *piVar5;
  FileDescriptorStream *extraout_RAX;
  FileDescriptorStream *extraout_RAX_00;
  FileDescriptorStream *pFVar6;
  undefined4 in_register_00000034;
  ssize_t len;
  size_t local_38;
  size_t toCopy;
  size_t left;
  char *ptr;
  size_t size_local;
  void *data_local;
  FileDescriptorStream *this_local;
  
  left = CONCAT44(in_register_00000034,__fd);
  ptr = (char *)__buf;
  size_local = left;
  data_local = this;
  if ((this->super_DisconnectableStream).super_SelectableStream.fd < 0) {
    __assert_fail("fd >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/aseba-community[P]dashel/dashel/dashel-posix.cpp"
                  ,0x33d,"virtual void Dashel::FileDescriptorStream::read(void *, size_t)");
  }
  pFVar6 = this;
  if (__buf != (void *)0x0) {
    toCopy = (size_t)__buf;
    uVar2 = (*(this->super_DisconnectableStream).super_SelectableStream._vptr_SelectableStream[3])()
    ;
    pFVar6 = (FileDescriptorStream *)CONCAT44(extraout_var,uVar2);
    if ((uVar2 & 1) != 0) {
      len = (this->super_DisconnectableStream).recvBufferSize -
            (this->super_DisconnectableStream).recvBufferPos;
      puVar3 = std::min<unsigned_long>((unsigned_long *)&len,(unsigned_long *)&ptr);
      local_38 = *puVar3;
      memcpy((void *)left,
             &(this->super_DisconnectableStream).super_SelectableStream.field_0x10 +
             (this->super_DisconnectableStream).recvBufferPos,local_38);
      (this->super_DisconnectableStream).recvBufferPos =
           local_38 + (this->super_DisconnectableStream).recvBufferPos;
      left = local_38 + left;
      pFVar6 = (FileDescriptorStream *)(toCopy - local_38);
      toCopy = (size_t)pFVar6;
    }
    while (toCopy != 0) {
      sVar4 = ::read((this->super_DisconnectableStream).super_SelectableStream.fd,(void *)left,
                     toCopy);
      if (sVar4 < 0) {
        p_Var1 = (this->super_DisconnectableStream).super_SelectableStream._vptr_SelectableStream
                 [-3];
        piVar5 = __errno_location();
        Stream::fail((Stream *)
                     ((long)&(this->super_DisconnectableStream).super_SelectableStream.
                             _vptr_SelectableStream + (long)p_Var1),IOError,*piVar5,
                     "File read I/O error.");
        pFVar6 = extraout_RAX;
      }
      else if (sVar4 == 0) {
        Stream::fail((Stream *)
                     ((long)&(this->super_DisconnectableStream).super_SelectableStream.
                             _vptr_SelectableStream +
                     (long)(this->super_DisconnectableStream).super_SelectableStream.
                           _vptr_SelectableStream[-3]),ConnectionLost,0,"Reached end of file.");
        pFVar6 = extraout_RAX_00;
      }
      else {
        left = sVar4 + left;
        pFVar6 = (FileDescriptorStream *)(toCopy - sVar4);
        toCopy = (size_t)pFVar6;
      }
    }
  }
  return (ssize_t)pFVar6;
}

Assistant:

virtual void read(void* data, size_t size)
		{
			assert(fd >= 0);

			if (size == 0)
				return;

			char* ptr = (char*)data;
			size_t left = size;

			if (isDataInRecvBuffer())
			{
				size_t toCopy = std::min(recvBufferSize - recvBufferPos, size);
				memcpy(ptr, recvBuffer + recvBufferPos, toCopy);
				recvBufferPos += toCopy;
				ptr += toCopy;
				left -= toCopy;
			}

			while (left)
			{
				ssize_t len = ::read(fd, ptr, left);

				if (len < 0)
				{
					fail(DashelException::IOError, errno, "File read I/O error.");
				}
				else if (len == 0)
				{
					fail(DashelException::ConnectionLost, 0, "Reached end of file.");
				}
				else
				{
					ptr += len;
					left -= len;
				}
			}
		}